

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall mpt::layout::set_property(layout *this)

{
  convertable *in_RDX;
  char *in_RSI;
  
  set_property((layout *)&this[-1]._parse,in_RSI,in_RDX);
  return;
}

Assistant:

int layout::set_property(const char *name, convertable *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((len = mpt_string_pset(&_alias, src)) >= 0) {
			return len;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		return MPT_ERROR(BadOperation);
	}
	if (!strcasecmp(name, "alias") || !strcasecmp(name, "name")) {
		return mpt_string_pset(&_alias, src);
	}
	if (!strcasecmp(name, "font")) {
		return mpt_string_pset(&_font, src);
	}
	return BadArgument;
}